

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vhost.c
# Opt level: O0

lws_vhost * lws_get_vhost_by_name(lws_context *context,char *name)

{
  int iVar1;
  lws_vhost *local_28;
  lws_vhost *v;
  char *name_local;
  lws_context *context_local;
  
  local_28 = context->vhost_list;
  while( true ) {
    if (local_28 == (lws_vhost *)0x0) {
      return (lws_vhost *)0x0;
    }
    if ((((byte)local_28->field_0x368 >> 2 & 1) == 0) &&
       (iVar1 = strcmp(local_28->name,name), iVar1 == 0)) break;
    local_28 = local_28->vhost_next;
  }
  return local_28;
}

Assistant:

struct lws_vhost *
lws_get_vhost_by_name(struct lws_context *context, const char *name)
{
	lws_start_foreach_ll(struct lws_vhost *, v,
			     context->vhost_list) {
		if (!v->being_destroyed && !strcmp(v->name, name))
			return v;

	} lws_end_foreach_ll(v, vhost_next);

	return NULL;
}